

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O1

void cast_to_int32(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  uVar1 = duckdb_shell_sqlite3_value_int(*argv,CONCAT44(in_register_00000034,argc));
  iVar2 = duckdb_shell_sqlite3_errcode((*argv)->db);
  if (iVar2 == 0x14) {
    duckdb_shell_sqlite3_result_null();
    return;
  }
  duckdb_shell_sqlite3_result_int(context,uVar1);
  return;
}

Assistant:

static void cast_to_int32(sqlite3_context *context, int argc, sqlite3_value **argv) {
	// argv[0] is not a 32-bit integer, internal casting must occur
	int value = sqlite3_value_int(argv[0]);
	if (sqlite3_errcode(argv[0]->db) == SQLITE_MISMATCH) {
		sqlite3_result_null(context);
	} else {
		sqlite3_result_int(context, value);
	}
}